

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

TileLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_tile(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  TileLayerParams *pTVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_tile(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_tile(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pTVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::TileLayerParams>(arena);
    (this->layer_).tile_ = pTVar2;
  }
  return (TileLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TileLayerParams* NeuralNetworkLayer::_internal_mutable_tile() {
  if (!_internal_has_tile()) {
    clear_layer();
    set_has_tile();
    layer_.tile_ = CreateMaybeMessage< ::CoreML::Specification::TileLayerParams >(GetArenaForAllocation());
  }
  return layer_.tile_;
}